

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O0

int __thiscall
ncnn::Convolution_x86::forward_int8_x86
          (Convolution_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  ulong uVar2;
  undefined8 *in_RCX;
  long *in_RDX;
  Option *in_RSI;
  long in_RDI;
  bool bVar3;
  Option *in_stack_00000100;
  int in_stack_0000010c;
  Mat *in_stack_00000110;
  Mat *in_stack_00000118;
  Mat *in_stack_00000120;
  Mat tmp_1;
  Mat tmp;
  int ret;
  int _nT;
  Mat top_blob_int32;
  bool prefer_winograd;
  int out_elempack_int32;
  int num_input;
  size_t out_elemsize;
  int out_elempack;
  bool use_int8_requantize;
  int outh;
  int outw;
  int kernel_extent_h;
  int kernel_extent_w;
  int elempack;
  int channels;
  int h;
  int w;
  Mat bottom_blob_bordered;
  Option opt_q;
  Mat bottom_blob_int8;
  int elembits;
  int in_stack_00000460;
  int in_stack_00000468;
  int in_stack_00000470;
  int in_stack_00000478;
  Option *in_stack_00000480;
  int in_stack_000035bc;
  int in_stack_000035c0;
  int in_stack_000035c4;
  Mat *in_stack_000035c8;
  Mat *in_stack_000035d0;
  Mat *in_stack_000035d8;
  int in_stack_0000b290;
  int in_stack_0000b298;
  int in_stack_0000b2a0;
  Option *in_stack_0000b2a8;
  Option *in_stack_fffffffffffffa18;
  Mat *in_stack_fffffffffffffa20;
  undefined4 in_stack_fffffffffffffa28;
  undefined4 in_stack_fffffffffffffa2c;
  Convolution *in_stack_fffffffffffffa30;
  int iVar4;
  size_t in_stack_fffffffffffffa38;
  int in_stack_fffffffffffffa44;
  int in_stack_fffffffffffffa48;
  int in_stack_fffffffffffffa4c;
  Mat *in_stack_fffffffffffffa50;
  void **ppvVar5;
  Mat *in_stack_fffffffffffffa58;
  Mat *in_stack_fffffffffffffa60;
  Allocator *in_stack_fffffffffffffab0;
  bool local_505;
  bool local_4f3;
  bool local_4f2;
  uint local_4e0;
  Option *in_stack_fffffffffffffb28;
  undefined7 in_stack_fffffffffffffb30;
  undefined1 in_stack_fffffffffffffb37;
  Mat *in_stack_fffffffffffffb38;
  undefined7 in_stack_fffffffffffffb40;
  undefined1 in_stack_fffffffffffffb47;
  bool local_4a9;
  int local_494;
  Mat *in_stack_fffffffffffffb80;
  void *__ptr;
  Mat *in_stack_fffffffffffffb88;
  int *piVar6;
  Mat *in_stack_fffffffffffffb90;
  Mat *in_stack_fffffffffffffb98;
  void *local_438;
  int *local_430;
  int in_stack_fffffffffffffbdc;
  undefined4 uVar7;
  Mat *in_stack_fffffffffffffbe0;
  Mat *in_stack_fffffffffffffbe8;
  Mat *in_stack_fffffffffffffbf0;
  Mat *in_stack_fffffffffffffbf8;
  Mat *in_stack_fffffffffffffc00;
  int local_3f0;
  void *local_3e8;
  int *local_3e0;
  void *local_3d8;
  int local_3d0;
  long *local_3c8;
  undefined4 local_3c0;
  undefined4 local_3bc;
  undefined4 local_3b8;
  undefined4 local_3b4;
  int local_3b0;
  void *local_3a8;
  bool local_399;
  undefined4 local_398;
  int local_394;
  ulong local_390;
  uint local_388;
  byte local_381;
  int local_380;
  int local_37c;
  int local_378;
  int local_374;
  int local_370;
  int local_36c;
  int local_368;
  int local_364;
  void *local_360;
  int *local_358;
  undefined8 local_350;
  int local_348;
  long *local_340;
  undefined4 local_338;
  int local_334;
  int local_330;
  undefined4 local_32c;
  int local_328;
  long local_320;
  undefined4 local_318;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  Mat *in_stack_fffffffffffffd20;
  Option *in_stack_fffffffffffffd28;
  void *local_2c8;
  Allocator *local_2c0;
  Allocator *local_2b8;
  int local_2b0;
  long *local_2a8;
  int local_2a0;
  undefined4 local_29c;
  int local_298;
  undefined4 local_294;
  int local_290;
  long local_288;
  int local_27c;
  undefined8 *local_278;
  long *local_270;
  int local_254;
  void **local_250;
  void **local_248;
  void **local_240;
  undefined1 *local_238;
  void **local_230;
  undefined1 *local_220;
  void **local_210;
  void **local_200;
  void **local_1f0;
  int local_1e0;
  undefined4 local_1dc;
  void **local_1d8;
  void **local_1d0;
  void **local_1c8;
  int local_1c0;
  undefined4 local_1bc;
  void **local_1b8;
  void **local_1b0;
  void **local_1a8;
  int local_1a0;
  undefined4 local_19c;
  void **local_198;
  int local_190;
  undefined4 local_18c;
  void **local_188;
  int in_stack_fffffffffffffe8c;
  int in_stack_fffffffffffffe90;
  int in_stack_fffffffffffffe94;
  Mat *in_stack_fffffffffffffe98;
  Mat *in_stack_fffffffffffffea0;
  Mat *in_stack_fffffffffffffea8;
  
  if (in_RSI->openmp_blocktime == 0) {
    local_494 = 0;
  }
  else {
    uVar2 = (long)in_RSI->workspace_allocator << 3;
    local_494 = (int)((long)((ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 | uVar2 & 0xffffffff) /
                     (long)in_RSI->openmp_blocktime);
  }
  local_27c = local_494;
  local_2c8 = *(void **)in_RSI;
  local_2c0 = in_RSI->blob_allocator;
  local_2b8 = in_RSI->workspace_allocator;
  local_2b0 = in_RSI->openmp_blocktime;
  local_2a8 = *(long **)&in_RSI->use_bf16_storage;
  local_2a0 = in_RSI->vulkan_device_index;
  local_29c._0_1_ = in_RSI->use_reserved_1;
  local_29c._1_1_ = in_RSI->use_image_storage;
  local_29c._2_1_ = in_RSI->use_tensor_storage;
  local_29c._3_1_ = in_RSI->use_reserved_2;
  local_298 = in_RSI->flush_denormals;
  local_294._0_1_ = in_RSI->use_local_pool_allocator;
  local_294._1_1_ = in_RSI->use_shader_local_memory;
  local_294._2_1_ = in_RSI->use_cooperative_matrix;
  local_294._3_1_ = in_RSI->use_winograd23_convolution;
  local_290._0_1_ = in_RSI->use_winograd43_convolution;
  local_290._1_1_ = in_RSI->use_winograd63_convolution;
  local_290._2_1_ = in_RSI->use_a53_a55_optimized_kernel;
  local_290._3_1_ = in_RSI->use_fp16_uniform;
  local_288._0_1_ = in_RSI[1].lightmode;
  local_288._1_1_ = in_RSI[1].use_shader_pack8;
  local_288._2_1_ = in_RSI[1].use_subgroup_ops;
  local_288._3_1_ = in_RSI[1].use_reserved_0;
  local_288._4_4_ = in_RSI[1].num_threads;
  if (local_2c0 != (Allocator *)0x0) {
    LOCK();
    *(int *)&local_2c0->_vptr_Allocator = *(int *)&local_2c0->_vptr_Allocator + 1;
    UNLOCK();
  }
  local_278 = in_RCX;
  local_270 = in_RDX;
  if (local_494 != 8) {
    local_308 = *in_RCX;
    local_2f8 = in_RCX[2];
    uStack_2f0 = in_RCX[3];
    local_2e8 = in_RCX[4];
    in_stack_fffffffffffffd20 = (Mat *)in_RCX[5];
    in_stack_fffffffffffffd28 = (Option *)in_RCX[6];
    uStack_300 = in_RCX[2];
    quantize_to_int8((Mat *)CONCAT17(in_stack_fffffffffffffb47,in_stack_fffffffffffffb40),
                     in_stack_fffffffffffffb38,
                     (Mat *)CONCAT17(in_stack_fffffffffffffb37,in_stack_fffffffffffffb30),
                     in_stack_fffffffffffffb28);
    local_4a9 = local_2c8 == (void *)0x0 || local_288 * local_290 == 0;
    if (local_4a9) {
      local_254 = -100;
      local_318 = 1;
      goto LAB_001ed651;
    }
  }
  local_250 = &local_360;
  local_360 = (void *)0x0;
  local_358 = (int *)0x0;
  local_350 = 0;
  local_348 = 0;
  local_340 = (long *)0x0;
  local_338 = 0;
  local_334 = 0;
  local_330 = 0;
  local_32c = 0;
  local_328 = 0;
  local_320 = 0;
  Convolution::make_padding
            (in_stack_fffffffffffffa30,
             (Mat *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28),
             in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
  iVar4 = (int)((ulong)in_stack_fffffffffffffa30 >> 0x20);
  if (local_360 == (void *)0x0 || local_320 * local_328 == 0) {
    local_254 = -100;
    local_318 = 1;
  }
  else {
    local_364 = local_334;
    local_368 = local_330;
    local_36c = local_328;
    local_370 = local_348;
    local_374 = *(int *)(in_RDI + 0xdc) * (*(int *)(in_RDI + 0xd4) + -1) + 1;
    local_378 = *(int *)(in_RDI + 0xe0) * (*(int *)(in_RDI + 0xd8) + -1) + 1;
    local_37c = (local_334 - local_374) / *(int *)(in_RDI + 0xe4) + 1;
    local_380 = (local_330 - local_378) / *(int *)(in_RDI + 0xe8) + 1;
    local_381 = 100 < *(int *)(in_RDI + 0x108);
    local_388 = 1;
    if ((*(byte *)((long)local_278 + 0x27) & 1) != 0) {
      if ((bool)local_381) {
        local_388 = 1;
        if (*(int *)(in_RDI + 0xd0) % 8 == 0) {
          local_388 = 8;
        }
      }
      else {
        local_388 = 1;
        if (*(int *)(in_RDI + 0xd0) % 4 == 0) {
          local_388 = 4;
        }
      }
    }
    if ((bool)local_381) {
      local_4e0 = local_388;
    }
    else {
      local_4e0 = local_388 << 2;
    }
    local_390 = (ulong)local_4e0;
    Mat::create(in_stack_fffffffffffffa50,in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48,
                in_stack_fffffffffffffa44,in_stack_fffffffffffffa38,iVar4,in_stack_fffffffffffffab0)
    ;
    bVar3 = true;
    if (*local_270 != 0) {
      bVar3 = local_270[8] * (long)(int)local_270[7] == 0;
    }
    if (bVar3) {
      local_254 = -100;
      local_318 = 1;
    }
    else {
      local_394 = local_36c * local_370;
      local_398 = 1;
      if ((*(byte *)((long)local_278 + 0x27) & 1) != 0) {
        if ((local_381 & 1) == 0) {
          local_398 = 1;
          if (*(int *)(in_RDI + 0xd0) % 4 == 0) {
            local_398 = 4;
          }
        }
        else {
          local_398 = 1;
          if (*(int *)(in_RDI + 0xd0) % 4 == 0) {
            local_398 = 4;
          }
        }
      }
      if (((*(byte *)((long)local_278 + 0x37) & 1) != 0) ||
         (local_4f2 = false, (*(byte *)(local_278 + 7) & 1) != 0)) {
        local_4f3 = true;
        if (local_394 < 9) {
          local_4f3 = 8 < *(int *)(in_RDI + 0xd0);
        }
        local_4f2 = local_4f3;
      }
      local_399 = local_4f2;
      if ((((*(byte *)((long)local_278 + 0x27) & 1) != 0) &&
          (((((((*(byte *)((long)local_278 + 0x1c) & 1) != 0 && (local_4f2 != false)) &&
              (*(int *)(in_RDI + 0xd4) == 3)) &&
             ((*(int *)(in_RDI + 0xd8) == 3 && (*(int *)(in_RDI + 0xdc) == 1)))) &&
            ((*(int *)(in_RDI + 0xe0) == 1 &&
             ((*(int *)(in_RDI + 0xe4) == 1 && (*(int *)(in_RDI + 0xe8) == 1)))))) ||
           ((*(byte *)((long)local_278 + 0x1d) & 1) == 0)))) &&
         (local_398 = 1, *(int *)(in_RDI + 0xd0) % 4 == 0)) {
        local_398 = 4;
      }
      local_248 = &local_3e8;
      local_3e8 = (void *)0x0;
      local_3e0 = (int *)0x0;
      local_3d8 = (void *)0x0;
      local_3d0 = 0;
      local_3c8 = (long *)0x0;
      local_3c0 = 0;
      local_3bc = 0;
      local_3b8 = 0;
      local_3b4 = 0;
      local_3b0 = 0;
      local_3a8 = (void *)0x0;
      Mat::create(in_stack_fffffffffffffa50,in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48,
                  in_stack_fffffffffffffa44,in_stack_fffffffffffffa38,iVar4,
                  in_stack_fffffffffffffab0);
      iVar4 = (int)((ulong)in_stack_fffffffffffffa50 >> 0x20);
      local_505 = local_3e8 == (void *)0x0 || (long)local_3a8 * (long)local_3b0 == 0;
      if (local_505) {
        local_254 = -100;
      }
      else {
        if ((*(int *)(in_RDI + 0x2d0) != 0) &&
           (*(int *)((long)local_278 + 4) != *(int *)(in_RDI + 0x2d0))) {
          fprintf(_stderr,"opt.num_threads %d changed, convolution gemm will use load-time value %d"
                  ,(ulong)*(uint *)((long)local_278 + 4),(ulong)*(uint *)(in_RDI + 0x2d0));
          fprintf(_stderr,"\n");
        }
        local_3f0 = 0;
        if (((((*(byte *)((long)local_278 + 0x1c) & 1) == 0) || ((local_399 & 1U) == 0)) ||
            (*(int *)(in_RDI + 0xd4) != 3)) ||
           (((*(int *)(in_RDI + 0xd8) != 3 || (*(int *)(in_RDI + 0xdc) != 1)) ||
            ((*(int *)(in_RDI + 0xe0) != 1 ||
             ((*(int *)(in_RDI + 0xe4) != 1 || (*(int *)(in_RDI + 0xe8) != 1)))))))) {
          if ((*(byte *)((long)local_278 + 0x1d) & 1) == 0) {
            convolution_packed_int8
                      (in_stack_000035d8,in_stack_000035d0,in_stack_000035c8,in_stack_000035c4,
                       in_stack_000035c0,in_stack_000035bc,in_stack_0000b290,in_stack_0000b298,
                       in_stack_0000b2a0,in_stack_0000b2a8);
          }
          else {
            local_3f0 = convolution_im2col_gemm_int8
                                  (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
                                   in_stack_fffffffffffffe98,in_stack_fffffffffffffe94,
                                   in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,
                                   in_stack_00000460,in_stack_00000468,in_stack_00000470,
                                   in_stack_00000478,in_stack_00000480);
          }
        }
        else {
          if ((*(byte *)(local_278 + 7) & 1) != 0) {
            bVar3 = true;
            if (*(long *)(in_RDI + 0x3b0) != 0) {
              bVar3 = *(long *)(in_RDI + 0x3f0) * (long)*(int *)(in_RDI + 1000) == 0;
            }
            if (!bVar3) {
              local_3f0 = conv3x3s1_winograd43_int8
                                    (in_stack_00000120,in_stack_00000118,in_stack_00000110,
                                     in_stack_0000010c,in_stack_00000100);
              goto LAB_001ec634;
            }
          }
          local_3f0 = conv3x3s1_winograd23_int8
                                (in_stack_00000120,in_stack_00000118,in_stack_00000110,
                                 in_stack_0000010c,in_stack_00000100);
        }
LAB_001ec634:
        if (local_3f0 == 0) {
          if (((*(byte *)((long)local_278 + 0x27) & 1) != 0) && ((local_381 & 1) != 0)) {
            if ((local_3d0 == 4) && (local_3b0 % 2 == 1)) {
              local_240 = &local_438;
              local_438 = (void *)0x0;
              local_430 = (int *)0x0;
              uVar7 = 0;
              in_stack_fffffffffffffbe8 = (Mat *)0x0;
              uVar7 = 0;
              uVar7 = 0;
              uVar7 = 0;
              uVar7 = 0;
              uVar7 = 0;
              convert_packing(in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,iVar4,
                              (Option *)
                              CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
              local_1b8 = &local_438;
              local_1b0 = &local_3e8;
              if (&local_3e8 != local_1b8) {
                if (local_430 != (int *)0x0) {
                  local_1bc = 1;
                  LOCK();
                  local_1c0 = *local_430;
                  *local_430 = *local_430 + 1;
                  UNLOCK();
                }
                ppvVar5 = &local_3e8;
                local_198 = &local_3e8;
                if (local_3e0 != (int *)0x0) {
                  local_19c = 0xffffffff;
                  LOCK();
                  local_1a0 = *local_3e0;
                  *local_3e0 = *local_3e0 + -1;
                  UNLOCK();
                  if (local_1a0 == 1) {
                    if (local_3c8 == (long *)0x0) {
                      if (local_3e8 != (void *)0x0) {
                        free(local_3e8);
                      }
                    }
                    else {
                      (**(code **)(*local_3c8 + 0x18))(local_3c8,local_3e8);
                    }
                  }
                }
                *ppvVar5 = (void *)0x0;
                ppvVar5[2] = (void *)0x0;
                *(undefined4 *)(ppvVar5 + 3) = 0;
                *(undefined4 *)(ppvVar5 + 5) = 0;
                *(undefined4 *)((long)ppvVar5 + 0x2c) = 0;
                *(undefined4 *)(ppvVar5 + 6) = 0;
                *(undefined4 *)((long)ppvVar5 + 0x34) = 0;
                *(undefined4 *)(ppvVar5 + 7) = 0;
                ppvVar5[8] = (void *)0x0;
                ppvVar5[1] = (void *)0x0;
                local_3e8 = *local_1b8;
                local_3e0 = (int *)local_1b8[1];
                local_3d8 = local_1b8[2];
                local_3d0 = *(int *)(local_1b8 + 3);
                local_3c8 = (long *)local_1b8[4];
                local_3c0 = *(undefined4 *)(local_1b8 + 5);
                local_3bc = *(undefined4 *)((long)local_1b8 + 0x2c);
                local_3b8 = *(undefined4 *)(local_1b8 + 6);
                local_3b4 = *(undefined4 *)((long)local_1b8 + 0x34);
                local_3b0 = *(int *)(local_1b8 + 7);
                local_3a8 = local_1b8[8];
              }
              local_230 = &local_438;
              local_1a8 = &local_3e8;
              if (local_430 != (int *)0x0) {
                LOCK();
                iVar1 = *local_430;
                *local_430 = *local_430 + -1;
                UNLOCK();
                if (iVar1 == 1) {
                  if (in_stack_fffffffffffffbe8 == (Mat *)0x0) {
                    if (local_438 != (void *)0x0) {
                      free(local_438);
                    }
                  }
                  else {
                    (**(code **)((long)in_stack_fffffffffffffbe8->data + 0x18))
                              (in_stack_fffffffffffffbe8,local_438);
                  }
                }
              }
              local_438 = (void *)0x0;
              in_stack_fffffffffffffbdc = 0;
              uVar7 = 0;
              uVar7 = 0;
              uVar7 = 0;
              uVar7 = 0;
              local_430 = (int *)0x0;
            }
            if ((local_3d0 == 4) && (local_3b0 % 2 == 0)) {
              local_238 = &stack0xfffffffffffffb80;
              __ptr = (void *)0x0;
              piVar6 = (int *)0x0;
              uVar7 = 0;
              convert_packing(in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,iVar4,
                              (Option *)
                              CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
              local_1d8 = (void **)&stack0xfffffffffffffb80;
              local_1d0 = &local_3e8;
              if (&local_3e8 != local_1d8) {
                if (piVar6 != (int *)0x0) {
                  local_1dc = 1;
                  LOCK();
                  local_1e0 = *piVar6;
                  *piVar6 = *piVar6 + 1;
                  UNLOCK();
                }
                local_188 = &local_3e8;
                if (local_3e0 != (int *)0x0) {
                  local_18c = 0xffffffff;
                  LOCK();
                  local_190 = *local_3e0;
                  *local_3e0 = *local_3e0 + -1;
                  UNLOCK();
                  if (local_190 == 1) {
                    if (local_3c8 == (long *)0x0) {
                      if (local_3e8 != (void *)0x0) {
                        free(local_3e8);
                      }
                    }
                    else {
                      (**(code **)(*local_3c8 + 0x18))(local_3c8,local_3e8);
                    }
                  }
                }
                local_3e8 = (void *)0x0;
                local_3d8 = (void *)0x0;
                local_3c0 = 0;
                local_3bc = 0;
                local_3b8 = 0;
                local_3b4 = 0;
                local_3a8 = (void *)0x0;
                local_3e0 = (int *)0x0;
                local_3e8 = *local_1d8;
                local_3e0 = (int *)local_1d8[1];
                local_3d8 = local_1d8[2];
                local_3c8 = (long *)local_1d8[4];
                local_3c0 = *(undefined4 *)(local_1d8 + 5);
                local_3bc = *(undefined4 *)((long)local_1d8 + 0x2c);
                local_3b8 = *(undefined4 *)(local_1d8 + 6);
                local_3b4 = *(undefined4 *)((long)local_1d8 + 0x34);
                local_3a8 = local_1d8[8];
              }
              local_220 = &stack0xfffffffffffffb80;
              local_1c8 = &local_3e8;
              if (piVar6 != (int *)0x0) {
                LOCK();
                iVar4 = *piVar6;
                *piVar6 = *piVar6 + -1;
                UNLOCK();
                if ((iVar4 == 1) && (__ptr != (void *)0x0)) {
                  free(__ptr);
                }
              }
              in_stack_fffffffffffffb80 = (Mat *)0x0;
              in_stack_fffffffffffffb90 = (Mat *)0x0;
              uVar7 = 0;
              in_stack_fffffffffffffb88 = (Mat *)0x0;
            }
          }
          if ((local_381 & 1) == 0) {
            dequantize_from_int32
                      (in_stack_fffffffffffffb98,in_stack_fffffffffffffb90,in_stack_fffffffffffffb88
                       ,in_stack_fffffffffffffb80,in_RSI);
            if (*(long *)(in_RDI + 0x2c8) != 0) {
              (**(code **)(**(long **)(in_RDI + 0x2c8) + 0x48))
                        (*(long **)(in_RDI + 0x2c8),local_270,local_278);
            }
          }
          else {
            requantize_from_int32_to_int8
                      (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0
                       ,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0,
                       in_stack_fffffffffffffbdc,in_stack_fffffffffffffd20,in_stack_fffffffffffffd28
                      );
          }
          local_254 = 0;
        }
        else {
          local_254 = local_3f0;
        }
      }
      local_318 = 1;
      local_210 = &local_3e8;
      if (local_3e0 != (int *)0x0) {
        LOCK();
        iVar4 = *local_3e0;
        *local_3e0 = *local_3e0 + -1;
        UNLOCK();
        if (iVar4 == 1) {
          if (local_3c8 == (long *)0x0) {
            if (local_3e8 != (void *)0x0) {
              free(local_3e8);
            }
          }
          else {
            (**(code **)(*local_3c8 + 0x18))(local_3c8,local_3e8);
          }
        }
      }
      local_3e8 = (void *)0x0;
      local_3d8 = (void *)0x0;
      local_3c0 = 0;
      local_3bc = 0;
      local_3b8 = 0;
      local_3b4 = 0;
      local_3a8 = (void *)0x0;
      local_3e0 = (int *)0x0;
    }
  }
  ppvVar5 = &local_360;
  local_200 = ppvVar5;
  if (local_358 != (int *)0x0) {
    LOCK();
    iVar4 = *local_358;
    *local_358 = *local_358 + -1;
    UNLOCK();
    if (iVar4 == 1) {
      if (local_340 == (long *)0x0) {
        if (local_360 != (void *)0x0) {
          free(local_360);
        }
      }
      else {
        (**(code **)(*local_340 + 0x18))(local_340,local_360);
      }
    }
  }
  *ppvVar5 = (void *)0x0;
  ppvVar5[2] = (void *)0x0;
  *(undefined4 *)(ppvVar5 + 3) = 0;
  *(undefined4 *)(ppvVar5 + 5) = 0;
  *(undefined4 *)((long)ppvVar5 + 0x2c) = 0;
  *(undefined4 *)(ppvVar5 + 6) = 0;
  *(undefined4 *)((long)ppvVar5 + 0x34) = 0;
  *(undefined4 *)(ppvVar5 + 7) = 0;
  ppvVar5[8] = (void *)0x0;
  ppvVar5[1] = (void *)0x0;
LAB_001ed651:
  ppvVar5 = &local_2c8;
  if (local_2c0 != (Allocator *)0x0) {
    LOCK();
    iVar4 = *(int *)&local_2c0->_vptr_Allocator;
    *(int *)&local_2c0->_vptr_Allocator = *(int *)&local_2c0->_vptr_Allocator + -1;
    UNLOCK();
    if (iVar4 == 1) {
      local_1f0 = ppvVar5;
      if (local_2a8 == (long *)0x0) {
        if (local_2c8 != (void *)0x0) {
          free(local_2c8);
        }
      }
      else {
        (**(code **)(*local_2a8 + 0x18))(local_2a8,local_2c8);
      }
    }
  }
  *ppvVar5 = (void *)0x0;
  ppvVar5[2] = (void *)0x0;
  *(undefined4 *)(ppvVar5 + 3) = 0;
  *(undefined4 *)(ppvVar5 + 5) = 0;
  *(undefined4 *)((long)ppvVar5 + 0x2c) = 0;
  *(undefined4 *)(ppvVar5 + 6) = 0;
  *(undefined4 *)((long)ppvVar5 + 0x34) = 0;
  *(undefined4 *)(ppvVar5 + 7) = 0;
  ppvVar5[8] = (void *)0x0;
  ppvVar5[1] = (void *)0x0;
  return local_254;
}

Assistant:

int Convolution_x86::forward_int8_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int elembits = bottom_blob.elembits();

    Mat bottom_blob_int8 = bottom_blob;
    if (elembits != 8)
    {
        Option opt_q = opt;
        opt_q.blob_allocator = opt.workspace_allocator;
        quantize_to_int8(bottom_blob, bottom_blob_int8, bottom_blob_int8_scales, opt_q);
        if (bottom_blob_int8.empty())
            return -100;
    }

    //     NCNN_LOGE("Convolution_x86 input %d x %d  ksize=%d %d  stride=%d %d", w, h, kernel_w, kernel_h, stride_w, stride_h);

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_int8, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    int w = bottom_blob_bordered.w;
    int h = bottom_blob_bordered.h;
    int channels = bottom_blob_bordered.c;
    int elempack = bottom_blob_bordered.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    bool use_int8_requantize = int8_scale_term > 100;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        if (use_int8_requantize)
            out_elempack = num_output % 8 == 0 ? 8 : 1;
        else
        {
#if __AVX512F__
            out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
            out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
            out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
        }
    }
#endif // __SSE2__
    size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

    //     NCNN_LOGE("forward_int8_x86 %d %d %d    %d %d", w, h, bottom_blob_bordered.c, elempack, out_elempack);

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    const int num_input = channels * elempack;

    int out_elempack_int32 = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        if (use_int8_requantize)
        {
#if __AVX__
            out_elempack_int32 = num_output % 8 == 0 ? 8 : 1;
#else
            out_elempack_int32 = num_output % 4 == 0 ? 4 : 1;
#endif
        }
        else
        {
#if __AVX512F__
            out_elempack_int32 = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
            out_elempack_int32 = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
            out_elempack_int32 = num_output % 4 == 0 ? 4 : 1;
#endif
        }
    }
#endif // __SSE2__

    bool prefer_winograd = (opt.use_winograd23_convolution || opt.use_winograd43_convolution) && (num_input > 8 || num_output > 8);

#if __SSE2__
    if (opt.use_packing_layout)
    {
        if ((opt.use_winograd_convolution && prefer_winograd && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1) || (!opt.use_sgemm_convolution))
        {
            // TODO implement winograd and packed int8 avx pack8 output
            out_elempack_int32 = num_output % 4 == 0 ? 4 : 1;
        }
    }
#endif // __SSE2__

    Mat top_blob_int32;
    top_blob_int32.create(outw, outh, num_output / out_elempack_int32, (size_t)(4u * out_elempack_int32), out_elempack_int32, opt.workspace_allocator);
    if (top_blob_int32.empty())
        return -100;

    int _nT = nT ? nT : opt.num_threads;
    if (nT != 0 && opt.num_threads != nT)
    {
        // force num_threads the same as in create_pipeline
        // so we could use pre-packed A/B from the same tile config
        NCNN_LOGE("opt.num_threads %d changed, convolution gemm will use load-time value %d", opt.num_threads, nT);
    }

    int ret = 0;
    if (opt.use_winograd_convolution && prefer_winograd && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
    {
        if (opt.use_winograd43_convolution && !weight_winograd43_data.empty())
            ret = conv3x3s1_winograd43_int8(bottom_blob_bordered, top_blob_int32, weight_winograd43_data, _nT, opt);
        else
            ret = conv3x3s1_winograd23_int8(bottom_blob_bordered, top_blob_int32, weight_winograd23_data, _nT, opt);
    }
    else if (opt.use_sgemm_convolution)
    {
        ret = convolution_im2col_gemm_int8(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, _nT, opt);
    }
    else
    {
        convolution_packed_int8(bottom_blob_bordered, top_blob_int32, weight_data_tm, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
    }
    if (ret != 0)
        return ret;

#if __SSE2__
    if (opt.use_packing_layout)
    {
        // NCNN_LOGE("top_blob_int32  %d  %d", top_blob_int32.c, top_blob_int32.elempack);
        if (use_int8_requantize)
        {
            // TODO implement winograd and packed int8 pack1 output
            if (top_blob_int32.elempack == 4 && top_blob_int32.c % 2 == 1)
            {
                Mat tmp;
                convert_packing(top_blob_int32, tmp, 1, opt);
                top_blob_int32 = tmp;
            }
            if (top_blob_int32.elempack == 4 && top_blob_int32.c % 2 == 0)
            {
                Mat tmp;
                convert_packing(top_blob_int32, tmp, 8, opt);
                top_blob_int32 = tmp;
            }
        }
        else
        {
#if __AVX__
            // TODO implement winograd and packed int8 avx pack8 output
            if (top_blob_int32.elempack == 4 && top_blob_int32.c % 2 == 0)
            {
                Mat tmp;
                convert_packing(top_blob_int32, tmp, 8, opt);
                top_blob_int32 = tmp;
            }
#endif // __AVX__
        }
    }
#endif

    if (use_int8_requantize)
    {
        requantize_from_int32_to_int8(top_blob_int32, top_blob, scale_in_data, top_blob_int8_scales, bias_data, activation_type, activation_params, opt);
    }
    else
    {
        dequantize_from_int32(top_blob_int32, top_blob, scale_in_data, bias_data, opt);

        if (activation)
        {
            activation->forward_inplace(top_blob, opt);
        }
    }

    return 0;
}